

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void * ggml_aligned_malloc(size_t size)

{
  int iVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  void *aligned_memory;
  void *local_10;
  
  if (size == 0) {
    ggml_log_internal(GGML_LOG_LEVEL_WARN,
                      "Behavior may be unexpected when allocating 0 bytes for ggml_aligned_malloc!\n"
                     );
    local_10 = (void *)0x0;
  }
  else {
    local_10 = (void *)0x0;
    iVar1 = posix_memalign(&local_10,0x40,size);
    if (iVar1 != 0) {
      if (iVar1 == 0xc) {
        pcVar2 = "insufficient memory";
      }
      else if (iVar1 == 0x16) {
        pcVar2 = "invalid alignment value";
      }
      else {
        pcVar2 = "unknown allocation error";
      }
      auVar3._8_4_ = (int)(size >> 0x20);
      auVar3._0_8_ = size;
      auVar3._12_4_ = 0x45300000;
      ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: %s (attempted to allocate %6.2f MB)\n",
                        ((auVar3._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) *
                        9.5367431640625e-07,"ggml_aligned_malloc",pcVar2);
      local_10 = (void *)0x0;
    }
  }
  return local_10;
}

Assistant:

void * ggml_aligned_malloc(size_t size) {
#if defined(__s390x__)
    const int alignment = 256;
#else
    const int alignment = 64;
#endif

#if defined(_MSC_VER) || defined(__MINGW32__)
    return _aligned_malloc(size, alignment);
#else
    if (size == 0) {
        GGML_LOG_WARN("Behavior may be unexpected when allocating 0 bytes for ggml_aligned_malloc!\n");
        return NULL;
    }
    void * aligned_memory = NULL;
  #ifdef GGML_USE_CPU_HBM
    int result = hbw_posix_memalign(&aligned_memory, alignment, size);
  #elif TARGET_OS_OSX
    GGML_UNUSED(alignment);
    kern_return_t alloc_status = vm_allocate((vm_map_t) mach_task_self(), (vm_address_t *) &aligned_memory, size, VM_FLAGS_ANYWHERE);
    int result = EFAULT;
    switch (alloc_status) {
        case KERN_SUCCESS:
            result = 0;
            break;
        case KERN_INVALID_ADDRESS:
            result = EINVAL;
            break;
        case KERN_NO_SPACE:
            result = ENOMEM;
            break;
        default:
            result = EFAULT;
            break;
    }
  #else
    int result = posix_memalign(&aligned_memory, alignment, size);
  #endif
    if (result != 0) {
        // Handle allocation failure
        const char *error_desc = "unknown allocation error";
        switch (result) {
            case EINVAL:
                error_desc = "invalid alignment value";
                break;
            case ENOMEM:
                error_desc = "insufficient memory";
                break;
        }
        GGML_LOG_ERROR("%s: %s (attempted to allocate %6.2f MB)\n", __func__, error_desc, size/(1024.0*1024.0));
        return NULL;
    }
    return aligned_memory;
#endif
}